

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *csid,uint8_t *src,uint8_t *end)

{
  uint16_t *puVar1;
  uint32_t *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  ptls_iovec_t pVar6;
  uint8_t *local_a8;
  size_t local_a0;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t local_78;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  byte *pbStack_38;
  int ret;
  uint8_t *src_local;
  uint16_t *csid_local;
  ptls_iovec_t *server_name_local;
  uint32_t *ticket_age_add_local;
  ptls_iovec_t *psk_local;
  uint64_t *issued_at_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    end_1 = (uint8_t *)0x0;
    pbStack_38 = src;
    do {
      pbVar4 = pbStack_38 + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*pbStack_38);
      _block_size = _block_size - 1;
      pbStack_38 = pbVar4;
    } while (_block_size != 0);
    if (end + -(long)pbVar4 < end_1) {
      _capacity._4_4_ = 0x32;
    }
    else {
      pbVar4 = pbVar4 + (long)end_1;
      src_local = (uint8_t *)csid;
      csid_local = (uint16_t *)server_name;
      server_name_local = (ptls_iovec_t *)ticket_age_add;
      ticket_age_add_local = (uint32_t *)psk;
      psk_local = (ptls_iovec_t *)issued_at;
      _capacity._4_4_ = decode64(issued_at,&stack0xffffffffffffffc8,pbVar4);
      puVar2 = ticket_age_add_local;
      if (_capacity._4_4_ == 0) {
        _block_size_1 = 2;
        if ((ulong)((long)pbVar4 - (long)pbStack_38) < 2) {
          _capacity._4_4_ = 0x32;
        }
        else {
          end_2 = (uint8_t *)0x0;
          do {
            pbVar5 = pbStack_38 + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*pbStack_38);
            _block_size_1 = _block_size_1 - 1;
            pbStack_38 = pbVar5;
          } while (_block_size_1 != 0);
          if (pbVar4 + -(long)pbVar5 < end_2) {
            _capacity._4_4_ = 0x32;
          }
          else {
            pVar6 = ptls_iovec_init(pbVar5,(long)(pbVar5 + (long)end_2) - (long)pbVar5);
            _capacity_2 = (size_t)pVar6.base;
            *(size_t *)puVar2 = _capacity_2;
            local_78 = pVar6.len;
            *(size_t *)(puVar2 + 2) = local_78;
            pbStack_38 = pbVar5 + (long)end_2;
            _capacity._4_4_ = decode16((uint16_t *)src_local,&stack0xffffffffffffffc8,pbVar4);
            if ((_capacity._4_4_ == 0) &&
               (_capacity._4_4_ =
                     decode32((uint32_t *)server_name_local,&stack0xffffffffffffffc8,pbVar4),
               puVar1 = csid_local, _capacity._4_4_ == 0)) {
              _block_size_2 = 2;
              if ((ulong)((long)pbVar4 - (long)pbStack_38) < 2) {
                _capacity._4_4_ = 0x32;
              }
              else {
                end_3 = (uint8_t *)0x0;
                do {
                  pbVar5 = pbStack_38 + 1;
                  end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*pbStack_38);
                  _block_size_2 = _block_size_2 - 1;
                  pbStack_38 = pbVar5;
                } while (_block_size_2 != 0);
                if (pbVar4 + -(long)pbVar5 < end_3) {
                  _capacity._4_4_ = 0x32;
                }
                else {
                  pbVar3 = pbVar5 + (long)end_3;
                  pVar6 = ptls_iovec_init(pbVar5,(long)pbVar3 - (long)pbVar5);
                  local_a8 = pVar6.base;
                  *(uint8_t **)puVar1 = local_a8;
                  local_a0 = pVar6.len;
                  *(size_t *)(puVar1 + 4) = local_a0;
                  if (pbVar3 == pbVar4) {
                    if (pbVar3 != end) {
                      _capacity._4_4_ = 0x32;
                    }
                  }
                  else {
                    _capacity._4_4_ = 0x32;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *csid, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if ((ret = decode64(issued_at, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}